

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_echo_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  epoll *__nptr;
  int *piVar2;
  size_t sVar3;
  ostream *poVar4;
  long *plVar5;
  char *pcVar6;
  undefined1 auVar7 [12];
  ipv4_endpoint endpoint;
  epoll tep;
  echo_tester tester;
  allocator local_106;
  allocator local_105;
  ipv4_address local_104;
  ipv4_endpoint local_100;
  double local_f8;
  epoll local_f0;
  echo_tester local_b8;
  
  if (argc == 3) {
    std::__cxx11::string::string((string *)&local_b8,argv[2],&local_105);
    __nptr = local_b8.ep;
    piVar2 = __errno_location();
    iVar1 = *piVar2;
    *piVar2 = 0;
    local_f8 = strtod((char *)__nptr,(char **)&local_f0);
    if ((epoll *)local_f0._0_8_ == __nptr) {
      auVar7 = std::__throw_invalid_argument("stod");
      std::
      _Rb_tree<echo_tester::connection_*,_std::pair<echo_tester::connection_*const,_std::unique_ptr<echo_tester::connection,_std::default_delete<echo_tester::connection>_>_>,_std::_Select1st<std::pair<echo_tester::connection_*const,_std::unique_ptr<echo_tester::connection,_std::default_delete<echo_tester::connection>_>_>_>,_std::less<echo_tester::connection_*>,_std::allocator<std::pair<echo_tester::connection_*const,_std::unique_ptr<echo_tester::connection,_std::default_delete<echo_tester::connection>_>_>_>_>
      ::~_Rb_tree(&local_b8.connections._M_t);
      timer_element::~timer_element(&local_b8.timer);
      std::
      _Rb_tree<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::_Identity<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::_Identity<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>_>
                   *)((long)&local_f0 + 8));
      file_descriptor::~file_descriptor(&local_f0.fd_);
      plVar5 = (long *)__cxa_begin_catch(auVar7._0_8_);
      if (auVar7._8_4_ == 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
        pcVar6 = (char *)(**(code **)(*plVar5 + 0x10))(plVar5);
        poVar4 = std::operator<<((ostream *)&std::cerr,pcVar6);
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"unknown exception in main",0x19);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      }
      __cxa_end_catch();
      return 1;
    }
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    else if (*piVar2 == 0x22) {
      std::__throw_out_of_range("stod");
      goto LAB_00106653;
    }
    std::__cxx11::string::string((string *)&local_f0,argv[1],&local_106);
    ipv4_address::ipv4_address(&local_104,(string *)&local_f0);
    ipv4_endpoint::ipv4_endpoint(&local_100,(uint16_t)(int)local_f8,local_104);
    if ((_Rb_tree_header *)local_f0._0_8_ !=
        &local_f0.timer_.queue._M_t._M_impl.super__Rb_tree_header) {
      operator_delete((void *)local_f0._0_8_);
    }
    if (local_b8.ep != (epoll *)&local_b8.timer.wakeup) {
      operator_delete(local_b8.ep);
    }
    poVar4 = operator<<((ostream *)&std::cout,&local_100);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    sysapi::epoll::epoll(&local_f0);
    echo_tester::echo_tester(&local_b8,&local_f0,local_100);
    sysapi::epoll::run(&local_f0);
    std::
    _Rb_tree<echo_tester::connection_*,_std::pair<echo_tester::connection_*const,_std::unique_ptr<echo_tester::connection,_std::default_delete<echo_tester::connection>_>_>,_std::_Select1st<std::pair<echo_tester::connection_*const,_std::unique_ptr<echo_tester::connection,_std::default_delete<echo_tester::connection>_>_>_>,_std::less<echo_tester::connection_*>,_std::allocator<std::pair<echo_tester::connection_*const,_std::unique_ptr<echo_tester::connection,_std::default_delete<echo_tester::connection>_>_>_>_>
    ::~_Rb_tree(&local_b8.connections._M_t);
    timer_element::~timer_element(&local_b8.timer);
    std::
    _Rb_tree<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::_Identity<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>,_std::_Identity<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::less<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>,_std::allocator<std::pair<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_timer_element_*>_>_>
                 *)((long)&local_f0 + 8));
    file_descriptor::~file_descriptor(&local_f0.fd_);
  }
  else {
LAB_00106653:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"usage: ",7);
    pcVar6 = *argv;
    if (pcVar6 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x112248);
    }
    else {
      sVar3 = strlen(pcVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," hostname port\n",0xf)
    ;
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
    try
    {
        if (argc != 3)
        {
            std::cerr << "usage: " << argv[0] << " hostname port\n";
            return 0;
        }

        ipv4_endpoint endpoint(std::stod(argv[2]), ipv4_address(argv[1]));
        std::cout << endpoint << std::endl;
        sysapi::epoll tep;
        echo_tester tester{tep, endpoint};
        tep.run();
    }
    catch (std::exception const& e)
    {
        std::cerr << "error: " << e.what() << std::endl;
        return EXIT_FAILURE;
    }
    catch (...)
    {
        std::cerr << "unknown exception in main" << std::endl;
        return EXIT_FAILURE;
    }

    return EXIT_SUCCESS;
}